

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall glslang::HlslParseContext::paramFix(HlslParseContext *this,TType *type)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  TQualifier *pTVar8;
  HlslParseContext *pHVar9;
  TQualifier *pTVar10;
  undefined8 *puVar11;
  byte bVar12;
  TQualifier bufferQualifier;
  TQualifier TStack_68;
  
  bVar12 = 0;
  iVar2 = (*type->_vptr_TType[10])(type);
  uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f;
  if (uVar3 < 2) {
    iVar2 = (*type->_vptr_TType[10])(type);
    lVar5 = CONCAT44(extraout_var_01,iVar2);
    uVar4 = *(ulong *)(lVar5 + 8) & 0xffffffffffffff80 | 0x10;
  }
  else {
    if (uVar3 == 6) {
      pHVar9 = (HlslParseContext *)type;
      iVar2 = (*type->_vptr_TType[10])();
      correctUniform(pHVar9,(TQualifier *)CONCAT44(extraout_var_02,iVar2));
      pTVar8 = &this->globalBufferDefaults;
      pTVar10 = &TStack_68;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pTVar10->semanticName = pTVar8->semanticName;
        pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar12 * -0x10 + 8);
        pTVar10 = (TQualifier *)((long)pTVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      pHVar9 = (HlslParseContext *)type;
      iVar2 = (*type->_vptr_TType[10])();
      mergeObjectLayoutQualifiers
                (pHVar9,&TStack_68,(TQualifier *)CONCAT44(extraout_var_03,iVar2),true);
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar1 = TStack_68._8_8_;
      uVar4 = (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f);
      TStack_68._8_8_ = TStack_68._8_8_ & 0xffffffffffffff80 | uVar4;
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar6 = *(ulong *)(CONCAT44(extraout_var_05,iVar2) + 8) & 0x800000000000;
      TStack_68._8_8_ = uVar1 & 0xffff7fffffffff80 | uVar4 | uVar6;
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar7 = *(ulong *)(CONCAT44(extraout_var_06,iVar2) + 8) & 0x2000000000000;
      TStack_68._8_8_ = uVar1 & 0xfffd7fffffffff80 | uVar4 | uVar6 | uVar7;
      iVar2 = (*type->_vptr_TType[10])(type);
      TStack_68._8_8_ =
           uVar1 & 0xfffd7ffffe00ff80 | uVar4 | uVar6 | uVar7 |
           (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_07,iVar2) + 8) & 0x1ff0000);
      iVar2 = (*type->_vptr_TType[10])(type);
      pTVar8 = &TStack_68;
      puVar11 = (undefined8 *)CONCAT44(extraout_var_08,iVar2);
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar11 = pTVar8->semanticName;
        pTVar8 = (TQualifier *)((long)pTVar8 + ((ulong)bVar12 * -2 + 1) * 8);
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      return;
    }
    if (uVar3 != 2) {
      return;
    }
    iVar2 = (*type->_vptr_TType[10])(type);
    lVar5 = CONCAT44(extraout_var_00,iVar2);
    uVar4 = *(ulong *)(lVar5 + 8) & 0xffffffffffffff80 | 0x13;
  }
  *(ulong *)(lVar5 + 8) = uVar4;
  return;
}

Assistant:

void HlslParseContext::paramFix(TType& type)
{
    switch (type.getQualifier().storage) {
    case EvqConst:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    case EvqBuffer:
        {
            // SSBO parameter.  These do not go through the declareBlock path since they are fn parameters.
            correctUniform(type.getQualifier());
            TQualifier bufferQualifier = globalBufferDefaults;
            mergeObjectLayoutQualifiers(bufferQualifier, type.getQualifier(), true);
            bufferQualifier.storage = type.getQualifier().storage;
            bufferQualifier.readonly = type.getQualifier().readonly;
            bufferQualifier.coherent = type.getQualifier().coherent;
            bufferQualifier.declaredBuiltIn = type.getQualifier().declaredBuiltIn;
            type.getQualifier() = bufferQualifier;
            break;
        }
    default:
        break;
    }
}